

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O0

void __thiscall wabt::WastParser::CheckImportOrdering(WastParser *this,Module *module)

{
  size_type sVar1;
  Location local_38;
  Module *local_18;
  Module *module_local;
  WastParser *this_local;
  
  local_18 = module;
  module_local = (Module *)this;
  sVar1 = std::vector<wabt::Func_*,_std::allocator<wabt::Func_*>_>::size(&module->funcs);
  if ((((sVar1 == local_18->num_func_imports) &&
       (sVar1 = std::vector<wabt::Table_*,_std::allocator<wabt::Table_*>_>::size(&local_18->tables),
       sVar1 == local_18->num_table_imports)) &&
      (sVar1 = std::vector<wabt::Memory_*,_std::allocator<wabt::Memory_*>_>::size
                         (&local_18->memories), sVar1 == local_18->num_memory_imports)) &&
     ((sVar1 = std::vector<wabt::Global_*,_std::allocator<wabt::Global_*>_>::size
                         (&local_18->globals), sVar1 == local_18->num_global_imports &&
      (sVar1 = std::vector<wabt::Event_*,_std::allocator<wabt::Event_*>_>::size(&local_18->events),
      sVar1 == local_18->num_event_imports)))) {
    return;
  }
  GetLocation(&local_38,this);
  Error(this,0x344274);
  return;
}

Assistant:

void WastParser::CheckImportOrdering(Module* module) {
  if (module->funcs.size() != module->num_func_imports ||
      module->tables.size() != module->num_table_imports ||
      module->memories.size() != module->num_memory_imports ||
      module->globals.size() != module->num_global_imports ||
      module->events.size() != module->num_event_imports) {
    Error(GetLocation(),
          "imports must occur before all non-import definitions");
  }
}